

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

DdNode * extraBddMove(DdManager *dd,DdNode *bF,DdNode *bDist)

{
  int *piVar1;
  DdHalfWord DVar2;
  DdNode *pDVar3;
  DdNode *data;
  int iVar4;
  DdNode *pDVar5;
  
  pDVar5 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  pDVar3 = bF;
  if ((pDVar5->index != 0x7fffffff) &&
     (pDVar3 = cuddCacheLookup2(dd,extraBddMove,bF,bDist), pDVar3 == (DdNode *)0x0)) {
    if (((ulong)bDist & 1) == 0) {
      DVar2 = bDist->index;
    }
    else {
      DVar2 = -*(int *)((ulong)bDist & 0xfffffffffffffffe);
    }
    iVar4 = pDVar5->index + DVar2;
    if (dd->size <= iVar4) {
      __assert_fail("VarNew < dd->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddMisc.c"
                    ,0x47f,"DdNode *extraBddMove(DdManager *, DdNode *, DdNode *)");
    }
    pDVar3 = (pDVar5->type).kids.E;
    if (pDVar5 == bF) {
      pDVar5 = (pDVar5->type).kids.T;
    }
    else {
      pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
      pDVar5 = (DdNode *)((ulong)(pDVar5->type).kids.T ^ 1);
    }
    pDVar3 = extraBddMove(dd,pDVar3,bDist);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar5 = extraBddMove(dd,pDVar5,bDist);
      if (pDVar5 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        data = cuddBddIteRecur(dd,dd->vars[iVar4],pDVar5,pDVar3);
        if (data != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)data & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,pDVar3);
          Cudd_RecursiveDeref(dd,pDVar5);
          cuddCacheInsert2(dd,extraBddMove,bF,bDist,data);
          piVar1 = (int *)(((ulong)data & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          return data;
        }
        Cudd_RecursiveDeref(dd,pDVar3);
        pDVar3 = pDVar5;
      }
      Cudd_RecursiveDeref(dd,pDVar3);
    }
    pDVar3 = (DdNode *)0x0;
  }
  return pDVar3;
}

Assistant:

DdNode * extraBddMove( 
  DdManager * dd,    /* the DD manager */
  DdNode * bF,
  DdNode * bDist) 
{
    DdNode * bRes;

    if ( Cudd_IsConstant(bF) )
        return bF;

    if ( (bRes = cuddCacheLookup2(dd, extraBddMove, bF, bDist)) )
        return bRes;
    else
    {
        DdNode * bRes0, * bRes1;             
        DdNode * bF0, * bF1;             
        DdNode * bFR = Cudd_Regular(bF); 
        int VarNew;
        
        if ( Cudd_IsComplement(bDist) )
            VarNew = bFR->index - Cudd_Not(bDist)->index;
        else
            VarNew = bFR->index + bDist->index;
        assert( VarNew < dd->size );

        // cofactor the functions
        if ( bFR != bF ) // bFunc is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }

        bRes0 = extraBddMove( dd, bF0, bDist );
        if ( bRes0 == NULL ) 
            return NULL;
        cuddRef( bRes0 );

        bRes1 = extraBddMove( dd, bF1, bDist );
        if ( bRes1 == NULL ) 
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            return NULL;
        }
        cuddRef( bRes1 );

        /* only bRes0 and bRes1 are referenced at this point */
        bRes = cuddBddIteRecur( dd, dd->vars[VarNew], bRes1, bRes0 );
        if ( bRes == NULL ) 
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            Cudd_RecursiveDeref( dd, bRes1 );
            return NULL;
        }
        cuddRef( bRes );
        Cudd_RecursiveDeref( dd, bRes0 );
        Cudd_RecursiveDeref( dd, bRes1 );

        /* insert the result into cache */
        cuddCacheInsert2( dd, extraBddMove, bF, bDist, bRes );
        cuddDeref( bRes );
        return bRes;
    }
}